

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O0

int bio_write(BIO *bio,char *buf,int num_)

{
  long *plVar1;
  bio_bio_st *local_50;
  size_t chunk;
  size_t write_offset;
  bio_bio_st *b;
  size_t rest;
  size_t num;
  char *pcStack_20;
  int num__local;
  char *buf_local;
  BIO *bio_local;
  
  rest = (size_t)num_;
  BIO_clear_retry_flags(bio);
  if (((bio->init == 0) || (buf == (char *)0x0)) || (rest == 0)) {
    bio_local._4_4_ = 0;
  }
  else {
    plVar1 = (long *)bio->ptr;
    if (plVar1 == (long *)0x0) {
      __assert_fail("b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xca,"int bio_write(BIO *, const char *, int)");
    }
    if (*plVar1 == 0) {
      __assert_fail("b->peer != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xcb,"int bio_write(BIO *, const char *, int)");
    }
    if (plVar1[5] == 0) {
      __assert_fail("b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xcc,"int bio_write(BIO *, const char *, int)");
    }
    plVar1[6] = 0;
    if ((int)plVar1[1] == 0) {
      if ((ulong)plVar1[4] < (ulong)plVar1[2]) {
        __assert_fail("b->len <= b->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                      ,0xd5,"int bio_write(BIO *, const char *, int)");
      }
      if (plVar1[2] == plVar1[4]) {
        BIO_set_retry_write(bio);
        bio_local._4_4_ = -1;
      }
      else {
        if ((ulong)(plVar1[4] - plVar1[2]) < rest) {
          rest = plVar1[4] - plVar1[2];
        }
        b = (bio_bio_st *)rest;
        pcStack_20 = buf;
        if (rest == 0) {
          __assert_fail("rest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                        ,0xe4,"int bio_write(BIO *, const char *, int)");
        }
        do {
          if ((ulong)plVar1[4] < (ulong)((long)&b->peer + plVar1[2])) {
            __assert_fail("b->len + rest <= b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xea,"int bio_write(BIO *, const char *, int)");
          }
          chunk = plVar1[3] + plVar1[2];
          if ((ulong)plVar1[4] <= chunk) {
            chunk = chunk - plVar1[4];
          }
          if ((ulong)plVar1[4] < (long)&b->peer + chunk) {
            local_50 = (bio_bio_st *)(plVar1[4] - chunk);
          }
          else {
            local_50 = b;
          }
          OPENSSL_memcpy((void *)(plVar1[5] + chunk),pcStack_20,(size_t)local_50);
          plVar1[2] = (long)&local_50->peer + plVar1[2];
          if ((ulong)plVar1[4] < (ulong)plVar1[2]) {
            __assert_fail("b->len <= b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xfd,"int bio_write(BIO *, const char *, int)");
          }
          b = (bio_bio_st *)((long)b - (long)local_50);
          pcStack_20 = pcStack_20 + (long)&local_50->peer;
        } while (b != (bio_bio_st *)0x0);
        bio_local._4_4_ = (int)rest;
      }
    }
    else {
      ERR_put_error(0x11,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xd1);
      bio_local._4_4_ = -1;
    }
  }
  return bio_local._4_4_;
}

Assistant:

static int bio_write(BIO *bio, const char *buf, int num_) {
  size_t num = num_;
  size_t rest;
  struct bio_bio_st *b;

  BIO_clear_retry_flags(bio);

  if (!bio->init || buf == NULL || num == 0) {
    return 0;
  }

  b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != NULL);
  assert(b->peer != NULL);
  assert(b->buf != NULL);

  b->request = 0;
  if (b->closed) {
    // we already closed
    OPENSSL_PUT_ERROR(BIO, BIO_R_BROKEN_PIPE);
    return -1;
  }

  assert(b->len <= b->size);

  if (b->len == b->size) {
    BIO_set_retry_write(bio);  // buffer is full
    return -1;
  }

  // we can write
  if (num > b->size - b->len) {
    num = b->size - b->len;
  }

  // now write "num" bytes
  rest = num;

  assert(rest > 0);
  // one or two iterations
  do {
    size_t write_offset;
    size_t chunk;

    assert(b->len + rest <= b->size);

    write_offset = b->offset + b->len;
    if (write_offset >= b->size) {
      write_offset -= b->size;
    }
    // b->buf[write_offset] is the first byte we can write to.

    if (write_offset + rest <= b->size) {
      chunk = rest;
    } else {
      // wrap around ring buffer
      chunk = b->size - write_offset;
    }

    OPENSSL_memcpy(b->buf + write_offset, buf, chunk);

    b->len += chunk;

    assert(b->len <= b->size);

    rest -= chunk;
    buf += chunk;
  } while (rest);

  // |num| is bounded by the buffer size, which fits in |int|.
  return (int)num;
}